

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O0

err_t cmdPwdReadShare_internal
                (cmd_pwd_t *pwd,size_t scount,size_t len,bool_t crc,char **shares,cmd_pwd_t spwd)

{
  err_t eVar1;
  bool_t bVar2;
  size_t *epki_len_00;
  size_t *pwd_00;
  octet *pwd_len;
  cmd_pwd_t pcVar3;
  int in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  long *in_RDI;
  octet *unaff_retaddr;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  octet *in_stack_00000018;
  size_t share_len;
  size_t pos;
  octet *pwd_bin;
  octet *epki;
  octet *state;
  octet *share;
  void *stack;
  size_t epki_len_max;
  size_t epki_len_min;
  size_t epki_len;
  err_t code;
  void *in_stack_ffffffffffffff38;
  octet *in_stack_ffffffffffffff40;
  size_t *in_stack_ffffffffffffff48;
  size_t *in_stack_ffffffffffffff50;
  octet *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  size_t in_stack_ffffffffffffff70;
  octet *in_stack_ffffffffffffff78;
  ulong uVar4;
  size_t *in_stack_ffffffffffffff80;
  octet *in_stack_ffffffffffffff88;
  size_t *epki_00;
  octet *in_stack_ffffffffffffffa0;
  size_t *share_len_00;
  octet *in_stack_ffffffffffffffa8;
  octet *local_50;
  octet *local_48;
  err_t local_3c;
  ulong local_20;
  err_t local_4;
  
  *in_RDI = 0;
  if (in_RDX == 0) {
    local_48 = (octet *)cmdFileSize((char *)in_stack_ffffffffffffff58);
    if (local_48 == (octet *)0xffffffffffffffff) {
      return 0xcf;
    }
    for (local_20 = 0x10; local_20 < 0x21; local_20 = local_20 + 8) {
      eVar1 = bpkiShareWrap(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            (octet *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                            in_stack_ffffffffffffff60,in_stack_ffffffffffffffa0,
                            (size_t)in_stack_ffffffffffffffa8);
      if (eVar1 != 0) {
        return eVar1;
      }
      in_stack_ffffffffffffff38 = (void *)0x0;
      in_stack_ffffffffffffff40 = (octet *)0xffffffffffffffff;
      eVar1 = bpkiShareWrap(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            (octet *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                            in_stack_ffffffffffffff60,in_stack_ffffffffffffffa0,
                            (size_t)in_stack_ffffffffffffffa8);
      if (eVar1 != 0) {
        return eVar1;
      }
      if ((local_50 <= local_48) && (local_48 <= in_stack_ffffffffffffffa8)) break;
    }
    if (0x20 < local_20) {
      return 0x132;
    }
  }
  else {
    eVar1 = bpkiShareWrap(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          (octet *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffffa0,
                          (size_t)in_stack_ffffffffffffffa8);
    if (eVar1 != 0) {
      return eVar1;
    }
    in_stack_ffffffffffffff38 = (void *)0x0;
    in_stack_ffffffffffffff40 = (octet *)0xffffffffffffffff;
    eVar1 = bpkiShareWrap(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          (octet *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffffa0,
                          (size_t)in_stack_ffffffffffffffa8);
    local_20 = in_RDX;
    if (eVar1 != 0) {
      return eVar1;
    }
  }
  epki_len_00 = (size_t *)blobCreate((size_t)in_stack_ffffffffffffff38);
  local_4 = 0x6e;
  if (epki_len_00 != (size_t *)0x0) {
    local_4 = 0;
  }
  if (local_4 == 0) {
    pwd_00 = (size_t *)((long)epki_len_00 + in_RSI * (local_20 + 1));
    pwd_len = (octet *)((long)pwd_00 + (long)in_stack_ffffffffffffffa8) + 1;
    epki_00 = epki_len_00;
    share_len_00 = epki_len_00;
    for (uVar4 = 0; uVar4 < in_RSI; uVar4 = uVar4 + 1) {
      eVar1 = cmdFileReadAll(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             (char *)in_stack_ffffffffffffff48);
      if (eVar1 != 0) {
        blobClose((blob_t)0x108320);
        return eVar1;
      }
      eVar1 = 0x132;
      if (local_50 <= local_48 && local_48 <= in_stack_ffffffffffffffa8) {
        eVar1 = 0;
      }
      if (eVar1 != 0) {
        blobClose((blob_t)0x108388);
        return eVar1;
      }
      eVar1 = cmdFileReadAll(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             (char *)in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff50 = pwd_00;
      if (eVar1 != 0) {
        blobClose((blob_t)0x1083d3);
        return eVar1;
      }
      in_stack_ffffffffffffff48 = (size_t *)((long)epki_00 + uVar4 * (local_20 + 1));
      in_stack_ffffffffffffff58 = local_48;
      pwd_00 = in_stack_ffffffffffffff50;
      strLen((char *)0x108439);
      eVar1 = bpkiShareUnwrap(in_stack_ffffffffffffffa8,share_len_00,(octet *)epki_00,
                              (size_t)epki_len_00,(octet *)pwd_00,(size_t)pwd_len);
      if (eVar1 != 0) {
        blobClose((blob_t)0x108475);
        return eVar1;
      }
      eVar1 = 0x132;
      if (in_stack_ffffffffffffff70 == local_20 + 1) {
        eVar1 = 0;
      }
      if (eVar1 != 0) {
        blobClose((blob_t)0x1084c1);
        return eVar1;
      }
    }
    local_3c = belsRecover2(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    if (local_3c == 0) {
      if (in_ECX != 0) {
        beltMACStart(in_stack_ffffffffffffff50,(octet *)in_stack_ffffffffffffff48,
                     (size_t)in_stack_ffffffffffffff40);
        beltMACStepA(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff40);
        bVar2 = beltMACStepV(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        if (bVar2 == 0) {
          local_3c = 0x200;
        }
      }
      if (local_3c == 0) {
        pcVar3 = cmdPwdCreate(0x1085ee);
        *in_RDI = (long)pcVar3;
        local_4 = 0x6e;
        if (*in_RDI != 0) {
          local_4 = 0;
        }
        if (local_4 == 0) {
          hexFrom((char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x10865d);
          blobClose((blob_t)0x108667);
        }
        else {
          blobClose((blob_t)0x108630);
        }
      }
      else {
        blobClose((blob_t)0x1085cb);
        local_4 = local_3c;
      }
    }
    else {
      blobClose((blob_t)0x108537);
      local_4 = local_3c;
    }
  }
  else {
    cmdPwdClose((cmd_pwd_t)0x108273);
  }
  return local_4;
}

Assistant:

static err_t cmdPwdReadShare_internal(cmd_pwd_t* pwd, size_t scount,
	size_t len, bool_t crc, char* shares[], const cmd_pwd_t spwd)
{
	err_t code;
	size_t epki_len;
	size_t epki_len_min;
	size_t epki_len_max;
	void* stack;
	octet* share;
	octet* state;
	octet* epki;
	octet* pwd_bin;
	size_t pos;
	// pre
	ASSERT(memIsValid(pwd, sizeof(cmd_pwd_t)));
	ASSERT(cmdPwdIsValid(spwd));
	ASSERT(2 <= scount && scount <= 16);
	ASSERT(len % 8 == 0 && len <= 32);
	ASSERT(!crc || len != 16);
	// пароль пока не создан
	*pwd = 0;
	// определить длину частичного секрета
	if (len == 0)
	{
		// определить размер первого файла с частичным секретом
		if ((epki_len = cmdFileSize(shares[0])) == SIZE_MAX)
			return ERR_FILE_READ;
		// найти подходящую длину
		for (len = 16; len <= 32; len += 8)
		{
			code = bpkiShareWrap(0, &epki_len_min, 0, len + 1, 0, 0, 0, 10000);
			ERR_CALL_CHECK(code);
			code = bpkiShareWrap(0, &epki_len_max, 0, len + 1, 0, 0, 0, 
				SIZE_MAX);
			ERR_CALL_CHECK(code);
			if (epki_len_min <= epki_len && epki_len <= epki_len_max)
				break;
		}
		if (len > 32)
			return ERR_BAD_FORMAT;
	}
	else
	{
		code = bpkiShareWrap(0, &epki_len_min, 0, len + 1, 0, 0, 0, 10000);
		ERR_CALL_CHECK(code);
		code = bpkiShareWrap(0, &epki_len_max, 0, len + 1, 0, 0, 0,	SIZE_MAX);
		ERR_CALL_CHECK(code);
	}
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, scount * (len + 1) + epki_len_max + 1 + len);
	ERR_CALL_HANDLE(code, cmdPwdClose(*pwd));
	share = state = (octet*)stack;
	epki = share + scount * (len + 1);
	pwd_bin = epki + epki_len_max + 1;
	// прочитать частичные секреты
	for (pos = 0; pos < scount; ++pos, ++shares)
	{
		size_t share_len;
		// определить длину контейнера
		code = cmdFileReadAll(0, &epki_len, *shares);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить длину
		code = (epki_len_min <= epki_len && epki_len <= epki_len_max) ?
			ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// читать
		code = cmdFileReadAll(epki, &epki_len, *shares);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// декодировать
		code = bpkiShareUnwrap(share + pos * (len + 1), &share_len,
			epki, epki_len, (const octet*)spwd, cmdPwdLen(spwd));
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		code = (share_len == len + 1) ? ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	}
	// собрать пароль
	code = belsRecover2(pwd_bin, scount, len, share);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить пароль
	if (crc)
	{
		beltMACStart(state, pwd_bin, len - 8);
		beltMACStepA(pwd_bin, len - 8, state);
		if (!beltMACStepV(pwd_bin + len - 8, state))
			code = ERR_BAD_CRC;
	}
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// создать выходной (текстовый) пароль
	*pwd = cmdPwdCreate(2 * len);
	code = *pwd ? ERR_OK : ERR_OUTOFMEMORY;
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	hexFrom(*pwd, pwd_bin, len);
	cmdBlobClose(stack);
	return code;
}